

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void av1_crc_calculator_init(CRC_CALCULATOR *p_crc_calculator,uint32_t bits,uint32_t truncPoly)

{
  uint uVar1;
  uint32_t value;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  p_crc_calculator->remainder = 0;
  p_crc_calculator->bits = bits;
  p_crc_calculator->trunc_poly = truncPoly;
  p_crc_calculator->final_result_mask = ~(-1 << ((byte)bits & 0x1f));
  uVar1 = 1 << ((byte)bits - 1 & 0x1f);
  lVar2 = 0;
  do {
    uVar4 = 0;
    uVar3 = 0x80;
    do {
      uVar5 = uVar3 & (uint)lVar2;
      if (uVar5 != 0) {
        uVar5 = uVar1;
      }
      uVar6 = (uVar5 ^ uVar4) & uVar1;
      if (uVar6 != 0) {
        uVar6 = truncPoly;
      }
      uVar4 = (uVar5 ^ uVar4) * 2 ^ uVar6;
      bVar7 = 1 < uVar3;
      uVar3 = uVar3 >> 1;
    } while (bVar7);
    p_crc_calculator->table[lVar2] = uVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  return;
}

Assistant:

void av1_crc_calculator_init(CRC_CALCULATOR *p_crc_calculator, uint32_t bits,
                             uint32_t truncPoly) {
  p_crc_calculator->remainder = 0;
  p_crc_calculator->bits = bits;
  p_crc_calculator->trunc_poly = truncPoly;
  p_crc_calculator->final_result_mask = (1 << bits) - 1;
  crc_calculator_init_table(p_crc_calculator);
}